

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::log_internal::LogMessage::
CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
          (LogMessage *this,string_view str)

{
  string_view value;
  bool bVar1;
  pointer pLVar2;
  Span<char> *pSVar3;
  size_t sVar4;
  size_type sVar5;
  Span<char> *this_00;
  Span<char> SVar6;
  log_internal *local_48;
  Span<char> start;
  undefined1 auStack_30 [7];
  uint8_t tag_value;
  Span<char> encoded_remaining_copy;
  LogMessage *this_local;
  string_view str_local;
  
  str_local._M_len = (size_t)str._M_str;
  this_local = (LogMessage *)str._M_len;
  encoded_remaining_copy.len_ = (size_type)this;
  pLVar2 = std::
           unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           ::operator->(&this->data_);
  pSVar3 = LogMessageData::encoded_remaining(pLVar2);
  _auStack_30 = pSVar3->ptr_;
  encoded_remaining_copy.ptr_ = (pointer)pSVar3->len_;
  sVar4 = BufferSizeFor(6,kLengthDelimited);
  sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  SVar6 = EncodeMessageStart(7,sVar4 + sVar5,(Span<char> *)auStack_30);
  value._M_str = (char *)str_local._M_len;
  value._M_len = (size_t)this_local;
  pSVar3 = (Span<char> *)auStack_30;
  bVar1 = EncodeStringTruncate(6,value,pSVar3);
  if (bVar1) {
    local_48 = (log_internal *)SVar6.ptr_;
    start.ptr_ = (pointer)SVar6.len_;
    SVar6.len_ = (size_type)auStack_30;
    SVar6.ptr_ = start.ptr_;
    EncodeMessageLength(local_48,SVar6,pSVar3);
    pLVar2 = std::
             unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             ::operator->(&this->data_);
    pSVar3 = LogMessageData::encoded_remaining(pLVar2);
    pSVar3->ptr_ = _auStack_30;
    pSVar3->len_ = (size_type)encoded_remaining_copy.ptr_;
  }
  else {
    pLVar2 = std::
             unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             ::operator->(&this->data_);
    pSVar3 = LogMessageData::encoded_remaining(pLVar2);
    pLVar2 = std::
             unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             ::operator->(&this->data_);
    this_00 = LogMessageData::encoded_remaining(pLVar2);
    sVar5 = Span<char>::size(this_00);
    Span<char>::remove_suffix(pSVar3,sVar5);
  }
  return;
}

Assistant:

void LogMessage::CopyToEncodedBuffer(absl::string_view str) {
  auto encoded_remaining_copy = data_->encoded_remaining();
  constexpr uint8_t tag_value = str_type == StringType::kLiteral
                                    ? ValueTag::kStringLiteral
                                    : ValueTag::kString;
  auto start = EncodeMessageStart(
      EventTag::kValue,
      BufferSizeFor(tag_value, WireType::kLengthDelimited) + str.size(),
      &encoded_remaining_copy);
  // If the `logging.proto.Event.value` field header did not fit,
  // `EncodeMessageStart` will have zeroed `encoded_remaining_copy`'s size and
  // `EncodeStringTruncate` will fail too.
  if (EncodeStringTruncate(tag_value, str, &encoded_remaining_copy)) {
    // The string may have been truncated, but the field header fit.
    EncodeMessageLength(start, &encoded_remaining_copy);
    data_->encoded_remaining() = encoded_remaining_copy;
  } else {
    // The field header(s) did not fit; zero `encoded_remaining()` so we don't
    // write anything else later.
    data_->encoded_remaining().remove_suffix(data_->encoded_remaining().size());
  }
}